

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

PortPackedStruct * __thiscall
kratos::Generator::port_packed
          (Generator *this,PortDirection direction,string *port_name,
          shared_ptr<kratos::PackedStruct> *packed_struct_,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size)

{
  shared_ptr<kratos::PortPackedStruct> sVar1;
  Generator *local_38;
  PortDirection local_2c;
  undefined1 auStack_28 [4];
  PortDirection direction_local;
  shared_ptr<kratos::PortPackedStruct> p;
  
  local_38 = this;
  local_2c = direction;
  sVar1 = std::
          make_shared<kratos::PortPackedStruct,kratos::Generator*,kratos::PortDirection&,std::__cxx11::string_const&,std::shared_ptr<kratos::PackedStruct>const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
                    ((Generator **)auStack_28,(PortDirection *)&local_38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c,
                     (shared_ptr<kratos::PackedStruct> *)port_name,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)packed_struct_);
  (*(this->super_IRNode)._vptr_IRNode[7])
            (this,port_name,
             sVar1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::PortPackedStruct>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::PortPackedStruct> *)auStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  return (PortPackedStruct *)_auStack_28;
}

Assistant:

PortPackedStruct &Generator::port_packed(PortDirection direction, const std::string &port_name,
                                         const std::shared_ptr<PackedStruct> &packed_struct_,
                                         const std::vector<uint32_t> &size) {
    auto p = std::make_shared<PortPackedStruct>(this, direction, port_name, packed_struct_, size);
    add_port_name(port_name);
    vars_.emplace(port_name, p);
    return *p;
}